

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyMemBackendRelease(SyMemBackend *pBackend)

{
  sxu32 *psVar1;
  SyMemBlock *pSVar2;
  SyMemMethods *pSVar3;
  _func_void_void_ptr *p_Var4;
  sxu32 sVar5;
  sxi32 sVar6;
  SyMutexMethods *UNRECOVERED_JUMPTABLE;
  SyMemBlock *pSVar7;
  
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
  }
  pSVar7 = pBackend->pBlocks;
  sVar5 = pBackend->nBlock;
  while (sVar5 != 0) {
    pSVar2 = pSVar7->pNext;
    (*pBackend->pMethods->xFree)(pSVar7);
    psVar1 = &pBackend->nBlock;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) break;
    pSVar7 = pSVar2->pNext;
    (*pBackend->pMethods->xFree)(pSVar2);
    psVar1 = &pBackend->nBlock;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) break;
    pSVar2 = pSVar7->pNext;
    (*pBackend->pMethods->xFree)(pSVar7);
    psVar1 = &pBackend->nBlock;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) break;
    pSVar7 = pSVar2->pNext;
    (*pBackend->pMethods->xFree)(pSVar2);
    sVar5 = pBackend->nBlock - 1;
    pBackend->nBlock = sVar5;
  }
  pSVar3 = pBackend->pMethods;
  p_Var4 = pSVar3->xRelease;
  if (p_Var4 != (_func_void_void_ptr *)0x0) {
    (*p_Var4)(pSVar3->pUserData);
  }
  pBackend->pMethods = (SyMemMethods *)0x0;
  pBackend->pBlocks = (SyMemBlock *)0x0;
  UNRECOVERED_JUMPTABLE = pBackend->pMutexMethods;
  if ((UNRECOVERED_JUMPTABLE != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    UNRECOVERED_JUMPTABLE = (SyMutexMethods *)(*UNRECOVERED_JUMPTABLE->xLeave)(pBackend->pMutex);
    if ((pBackend->pMutex != (SyMutex *)0x0) &&
       (UNRECOVERED_JUMPTABLE = (SyMutexMethods *)pBackend->pMutexMethods->xRelease,
       UNRECOVERED_JUMPTABLE != (SyMutexMethods *)0x0)) {
      sVar6 = (*(code *)UNRECOVERED_JUMPTABLE)();
      return sVar6;
    }
  }
  return (sxi32)UNRECOVERED_JUMPTABLE;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendRelease(SyMemBackend *pBackend)
{
	sxi32 rc;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend) ){
		return SXERR_INVALID;
	}
#endif
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	rc = MemBackendRelease(&(*pBackend));
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
		SyMutexRelease(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return rc;
}